

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O0

void __thiscall
midi_container::get_meta_data(midi_container *this,unsigned_long subsong,midi_meta_data *p_out)

{
  size_type sVar1;
  ulong uVar2;
  size_t sVar3;
  unsigned_long uVar4;
  reference pvVar5;
  char *pcVar6;
  midi_meta_data_item local_288;
  midi_meta_data_item local_240;
  midi_meta_data_item local_1f8;
  midi_meta_data_item local_1b0;
  midi_meta_data_item local_168;
  midi_meta_data_item local_110;
  char *local_c8;
  char *type;
  uchar test2;
  unsigned_long uStack_b8;
  uchar test;
  size_t data_count;
  midi_event *event;
  reference pvStack_a0;
  uint j;
  midi_track *track;
  unsigned_long tempo_track;
  unsigned_long i;
  undefined1 local_80 [6];
  bool type_non_gm_found;
  bool type_found;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string convert;
  char temp [32];
  midi_meta_data *p_out_local;
  unsigned_long subsong_local;
  midi_container *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  i._7_1_ = 0;
  i._6_1_ = 0;
  for (tempo_track = 0; uVar4 = tempo_track,
      sVar1 = std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks),
      uVar4 < sVar1; tempo_track = tempo_track + 1) {
    if ((this->m_form != 2) || (tempo_track == subsong)) {
      track = (midi_track *)0x0;
      if (this->m_form == 2) {
        track = (midi_track *)tempo_track;
      }
      pvStack_a0 = std::vector<midi_track,_std::allocator<midi_track>_>::operator[]
                             (&this->m_tracks,tempo_track);
      for (event._4_4_ = 0; uVar2 = (ulong)event._4_4_, sVar3 = midi_track::get_count(pvStack_a0),
          uVar2 < sVar3; event._4_4_ = event._4_4_ + 1) {
        data_count = (size_t)midi_track::operator[](pvStack_a0,(ulong)event._4_4_);
        if (((midi_event *)data_count)->m_type == extended) {
          uStack_b8 = midi_event::get_data_count((midi_event *)data_count);
          if ((((i._6_1_ & 1) == 0) && (uStack_b8 != 0)) && (*(char *)(data_count + 0x18) == -0x10))
          {
            type._7_1_ = '\0';
            type._6_1_ = '\0';
            if (1 < uStack_b8) {
              type._7_1_ = *(char *)(data_count + 0x19);
            }
            if (3 < uStack_b8) {
              type._6_1_ = *(char *)(data_count + 0x1b);
            }
            local_c8 = (char *)0x0;
            if (type._7_1_ == 'A') {
              if (type._6_1_ == 'B') {
                local_c8 = "GS";
              }
              else if (type._6_1_ == '\x16') {
                local_c8 = "MT-32";
              }
              else if (type._6_1_ == '\x14') {
                local_c8 = "D-50";
              }
            }
            else if (type._7_1_ == 'B') {
              local_c8 = "X5";
            }
            else if (type._7_1_ == 'C') {
              local_c8 = "XG";
            }
            else if (type._7_1_ == '~') {
              i._7_1_ = 1;
            }
            if (local_c8 != (char *)0x0) {
              i._7_1_ = 1;
              i._6_1_ = 1;
              uVar4 = timestamp_to_ms(this,*(unsigned_long *)data_count,(unsigned_long)track);
              midi_meta_data_item::midi_meta_data_item(&local_110,uVar4,"type",local_c8);
              midi_meta_data::add_item(p_out,&local_110);
              midi_meta_data_item::~midi_meta_data_item(&local_110);
            }
          }
          else if ((1 < uStack_b8) && (*(char *)(data_count + 0x18) == -1)) {
            uStack_b8 = uStack_b8 - 2;
            switch(*(undefined1 *)(data_count + 0x19)) {
            case 1:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,uStack_b8
                        );
              sVar3 = data_count;
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                                  0);
              midi_event::copy_data((midi_event *)sVar3,pvVar5,2,uStack_b8);
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                                  0);
              convert_mess_to_utf8
                        ((char *)pvVar5,uStack_b8,
                         (string *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              snprintf(convert.field_2._M_local_buf + 8,0x1f,"track_text_%02lu",tempo_track);
              uVar4 = timestamp_to_ms(this,*(unsigned_long *)data_count,(unsigned_long)track);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              midi_meta_data_item::midi_meta_data_item
                        (&local_1f8,uVar4,convert.field_2._M_local_buf + 8,pcVar6);
              midi_meta_data::add_item(p_out,&local_1f8);
              midi_meta_data_item::~midi_meta_data_item(&local_1f8);
              break;
            case 2:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,uStack_b8
                        );
              sVar3 = data_count;
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                                  0);
              midi_event::copy_data((midi_event *)sVar3,pvVar5,2,uStack_b8);
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                                  0);
              convert_mess_to_utf8
                        ((char *)pvVar5,uStack_b8,
                         (string *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              uVar4 = timestamp_to_ms(this,*(unsigned_long *)data_count,(unsigned_long)track);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              midi_meta_data_item::midi_meta_data_item(&local_1b0,uVar4,"copyright",pcVar6);
              midi_meta_data::add_item(p_out,&local_1b0);
              midi_meta_data_item::~midi_meta_data_item(&local_1b0);
              break;
            case 3:
            case 4:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,uStack_b8
                        );
              sVar3 = data_count;
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                                  0);
              midi_event::copy_data((midi_event *)sVar3,pvVar5,2,uStack_b8);
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                                  0);
              convert_mess_to_utf8
                        ((char *)pvVar5,uStack_b8,
                         (string *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              snprintf(convert.field_2._M_local_buf + 8,0x1f,"track_name_%02lu",tempo_track);
              uVar4 = timestamp_to_ms(this,*(unsigned_long *)data_count,(unsigned_long)track);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              midi_meta_data_item::midi_meta_data_item
                        (&local_240,uVar4,convert.field_2._M_local_buf + 8,pcVar6);
              midi_meta_data::add_item(p_out,&local_240);
              midi_meta_data_item::~midi_meta_data_item(&local_240);
              break;
            case 6:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,uStack_b8
                        );
              sVar3 = data_count;
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                                  0);
              midi_event::copy_data((midi_event *)sVar3,pvVar5,2,uStack_b8);
              pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                                  0);
              convert_mess_to_utf8
                        ((char *)pvVar5,uStack_b8,
                         (string *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              uVar4 = timestamp_to_ms(this,*(unsigned_long *)data_count,(unsigned_long)track);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              midi_meta_data_item::midi_meta_data_item(&local_168,uVar4,"track_marker",pcVar6);
              midi_meta_data::add_item(p_out,&local_168);
              midi_meta_data_item::~midi_meta_data_item(&local_168);
            }
          }
        }
      }
    }
  }
  if (((i._7_1_ & 1) != 0) && ((i._6_1_ & 1) == 0)) {
    midi_meta_data_item::midi_meta_data_item(&local_288,0,"type","GM");
    midi_meta_data::add_item(p_out,&local_288);
    midi_meta_data_item::~midi_meta_data_item(&local_288);
  }
  midi_meta_data::append(p_out,&this->m_extra_meta_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  std::__cxx11::string::~string
            ((string *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void midi_container::get_meta_data( unsigned long subsong, midi_meta_data & p_out )
{
    char temp[32];
    std::string convert;

    std::vector<uint8_t> data;

    bool type_found = false;
    bool type_non_gm_found = false;

    for ( unsigned long i = 0; i < m_tracks.size(); ++i )
    {
        if ( m_form == 2 && i != subsong ) continue;

        unsigned long tempo_track = 0;
        if ( m_form == 2 ) tempo_track = i;

        const midi_track & track = m_tracks[ i ];
        for ( unsigned j = 0; j < track.get_count(); ++j )
        {
            const midi_event & event = track[ j ];
            if ( event.m_type == midi_event::extended )
            {
                std::size_t data_count = event.get_data_count();
                if ( !type_non_gm_found && data_count >= 1 && event.m_data[ 0 ] == 0xF0 )
                {
                    unsigned char test = 0;
                    unsigned char test2 = 0;
                    if ( data_count > 1 ) test  = event.m_data[ 1 ];
                    if ( data_count > 3 ) test2 = event.m_data[ 3 ];

                    const char * type = NULL;

                    switch( test )
                    {
                    case 0x7E:
                        type_found = true;
                        break;
                    case 0x43:
                        type = "XG";
                        break;
                    case 0x42:
                        type = "X5";
                        break;
                    case 0x41:
                        if ( test2 == 0x42 ) type = "GS";
                        else if ( test2 == 0x16 ) type = "MT-32";
                        else if ( test2 == 0x14 ) type = "D-50";
                    }

                    if ( type )
                    {
                        type_found = true;
                        type_non_gm_found = true;
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), "type", type ) );
                    }
                }
                else if ( data_count >= 2 && event.m_data[ 0 ] == 0xFF )
                {
                    data_count -= 2;
                    switch ( event.m_data[ 1 ] )
                    {
                    case 6:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), "track_marker", convert.c_str() ) );
                        break;

                    case 2:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), "copyright", convert.c_str() ) );
                        break;

                    case 1:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        snprintf(temp, 31, "track_text_%02lu", i);
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), temp, convert.c_str() ) );
                        break;

                    case 3:
                    case 4:
                        data.resize( data_count );
                        event.copy_data( &data[0], 2, data_count );
                        convert_mess_to_utf8( ( const char * ) &data[0], data_count, convert );
                        snprintf(temp, 31, "track_name_%02lu", i);
                        p_out.add_item( midi_meta_data_item( timestamp_to_ms( event.m_timestamp, tempo_track ), temp, convert.c_str() ) );
                        break;
                    }
                }
            }
        }
    }

    if ( type_found && !type_non_gm_found )
    {
        p_out.add_item( midi_meta_data_item( 0, "type", "GM" ) );
    }

    p_out.append( m_extra_meta_data );
}